

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Object * __thiscall json::Object::add<json::Integer,long>(Object *this,string *key,long *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  Integer *pIVar4;
  runtime_error *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common::XPtr<json::Type>_>_>,_bool>
  pVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::Integer_*>
  local_58;
  
  pIVar4 = (Integer *)operator_new(0x10);
  lVar2 = *v;
  (pIVar4->super_Type)._vptr_Type = (_func_int **)&PTR_clone_00128c18;
  pIVar4->value = lVar2;
  paVar1 = &local_58.first.field_2;
  pcVar3 = (key->_M_dataplus)._M_p;
  local_58.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + key->_M_string_length);
  local_58.second = pIVar4;
  pVar5 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>,std::_Select1st<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>,std::less<std::__cxx11::string>,common::clean_allocator<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,json::Integer*>>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>,std::_Select1st<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>,std::less<std::__cxx11::string>,common::clean_allocator<std::pair<std::__cxx11::string_const,common::XPtr<json::Type>>>>
                      *)&this->fields,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    return this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"can\'t insert field");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Object& add(std::string const& key, V const& v) {
            json_assert(fields.insert(std::make_pair(key, new T(v))).second, "can't insert field");
            return *this;
        }